

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall
cppcms::impl::garbage_collector::garbage_collector
          (garbage_collector *this,shared_ptr<cppcms::sessions::session_storage_factory> *f,
          int seconds)

{
  booster::aio::io_service::io_service(&this->srv_);
  booster::aio::deadline_timer::deadline_timer(&this->timer_,&this->srv_);
  std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->io_).
                super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
               ,&f->
                 super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              );
  this->seconds_ = seconds;
  return;
}

Assistant:

garbage_collector(	booster::shared_ptr<cppcms::sessions::session_storage_factory> f,
				int seconds)
		:	timer_(srv_),
			io_(f),
			seconds_(seconds)
	{
	}